

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder__on_read_memory
                    (ma_decoder *pDecoder,void *pBufferOut,size_t bytesToRead,size_t *pBytesRead)

{
  ulong uVar1;
  size_t *in_RCX;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t bytesRemaining;
  undefined8 local_20;
  undefined4 local_4;
  
  if (in_RCX != (size_t *)0x0) {
    *in_RCX = 0;
  }
  uVar1 = *(long *)(in_RDI + 0x218) - *(long *)(in_RDI + 0x220);
  local_20 = in_RDX;
  if (uVar1 < in_RDX) {
    local_20 = uVar1;
  }
  if (uVar1 == 0) {
    local_4 = MA_AT_END;
  }
  else {
    if (local_20 != 0) {
      memcpy(in_RSI,(void *)(*(long *)(in_RDI + 0x210) + *(long *)(in_RDI + 0x220)),local_20);
      *(ulong *)(in_RDI + 0x220) = local_20 + *(long *)(in_RDI + 0x220);
    }
    if (in_RCX != (size_t *)0x0) {
      *in_RCX = local_20;
    }
    local_4 = MA_SUCCESS;
  }
  return local_4;
}

Assistant:

static ma_result ma_decoder__on_read_memory(ma_decoder* pDecoder, void* pBufferOut, size_t bytesToRead, size_t* pBytesRead)
{
    size_t bytesRemaining;

    MA_ASSERT(pDecoder->data.memory.dataSize >= pDecoder->data.memory.currentReadPos);

    if (pBytesRead != NULL) {
        *pBytesRead = 0;
    }

    bytesRemaining = pDecoder->data.memory.dataSize - pDecoder->data.memory.currentReadPos;
    if (bytesToRead > bytesRemaining) {
        bytesToRead = bytesRemaining;
    }

    if (bytesRemaining == 0) {
        return MA_AT_END;
    }

    if (bytesToRead > 0) {
        MA_COPY_MEMORY(pBufferOut, pDecoder->data.memory.pData + pDecoder->data.memory.currentReadPos, bytesToRead);
        pDecoder->data.memory.currentReadPos += bytesToRead;
    }

    if (pBytesRead != NULL) {
        *pBytesRead = bytesToRead;
    }

    return MA_SUCCESS;
}